

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

optional<Rgba> parseColor(string *str,size_type *n,uint16_t i)

{
  optional<unsigned_char> oVar1;
  optional<unsigned_char> oVar2;
  optional<unsigned_char> oVar3;
  _Storage<Rgba,_true> extraout_EAX;
  _Storage<Rgba,_true> _Var4;
  optional<Rgba> oVar5;
  pointer pcVar6;
  bool bVar7;
  ulong uVar8;
  char *fmt;
  
  oVar1 = parseDec<unsigned_char>(str,n);
  if (((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
    uVar8 = (ulong)(i + 1);
    pcVar6 = (str->_M_dataplus)._M_p;
    fmt = "Failed to parse color #%u (\"%s\"): invalid red component";
  }
  else {
    skipWhitespace<std::__cxx11::string>(str,n);
    if (*n == str->_M_string_length) {
      uVar8 = (ulong)(i + 1);
      pcVar6 = (str->_M_dataplus)._M_p;
      fmt = "Failed to parse color #%u (\"%s\"): missing green component";
    }
    else {
      oVar2 = parseDec<unsigned_char>(str,n);
      if (((ushort)oVar2.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
        uVar8 = (ulong)(i + 1);
        pcVar6 = (str->_M_dataplus)._M_p;
        fmt = "Failed to parse color #%u (\"%s\"): invalid green component";
      }
      else {
        skipWhitespace<std::__cxx11::string>(str,n);
        if (*n == str->_M_string_length) {
          uVar8 = (ulong)(i + 1);
          pcVar6 = (str->_M_dataplus)._M_p;
          fmt = "Failed to parse color #%u (\"%s\"): missing blue component";
        }
        else {
          oVar3 = parseDec<unsigned_char>(str,n);
          if (((ushort)oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_char> >> 8 & 1) != 0) {
            _Var4 = (_Storage<Rgba,_true>)
                    ((ushort)oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_char> & 0xff |
                     ((ushort)oVar2.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_char> & 0xff) << 8 |
                     (uint)(ushort)oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                                   super__Optional_payload_base<unsigned_char> << 0x10 | 0xff000000)
            ;
            bVar7 = true;
            goto LAB_0010c6bd;
          }
          uVar8 = (ulong)(i + 1);
          pcVar6 = (str->_M_dataplus)._M_p;
          fmt = "Failed to parse color #%u (\"%s\"): invalid blue component";
        }
      }
    }
  }
  bVar7 = false;
  error(fmt,uVar8,pcVar6);
  _Var4 = extraout_EAX;
LAB_0010c6bd:
  oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_engaged = bVar7;
  oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_payload = _Var4;
  return (optional<Rgba>)
         oVar5.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>;
}

Assistant:

static std::optional<Rgba> parseColor(std::string const &str, std::string::size_type &n,
                                      uint16_t i) {
	std::optional<uint8_t> r = parseDec<uint8_t>(str, n);
	if (!r) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid red component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> g = parseDec<uint8_t>(str, n);
	if (!g) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> b = parseDec<uint8_t>(str, n);
	if (!b) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}

	return std::optional<Rgba>{Rgba(*r, *g, *b, 0xFF)};
}